

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O2

INT Internal_AddPaddingVfprintf
              (CPalThread *pthrCurrent,PAL_FILE *stream,LPSTR In,INT Padding,INT Flags)

{
  int iVar1;
  errno_t eVar2;
  INT IVar3;
  size_t sVar4;
  char *_Dst;
  int *piVar5;
  char *_Dst_00;
  int iVar7;
  int iVar8;
  bool bVar9;
  size_t sVar6;
  
  sVar4 = strlen(In);
  iVar8 = 0;
  if (0 < Padding) {
    iVar8 = Padding;
  }
  iVar1 = (int)sVar4;
  iVar7 = iVar8 + iVar1 + 1;
  _Dst = (char *)CorUnix::InternalMalloc((long)iVar7);
  if (_Dst == (char *)0x0) {
    if (PAL_InitializeChakraCoreCalled != false) {
      piVar5 = __errno_location();
      *piVar5 = 8;
      return -1;
    }
    goto LAB_0011a3a1;
  }
  _Dst_00 = _Dst;
  if ((Flags & 1U) == 0) {
LAB_0011a2e0:
    if (0 < Padding) {
      iVar7 = iVar7 - Padding;
      if ((Flags & 4U) == 0) {
        while (bVar9 = Padding != 0, Padding = Padding + -1, bVar9) {
          *_Dst_00 = ' ';
          _Dst_00 = _Dst_00 + 1;
        }
      }
      else {
        while (bVar9 = Padding != 0, Padding = Padding + -1, bVar9) {
          *_Dst_00 = '0';
          _Dst_00 = _Dst_00 + 1;
        }
      }
    }
    if (((Flags & 1U) != 0) || (eVar2 = strcpy_s(_Dst_00,(long)iVar7,In), eVar2 == 0)) {
      sVar6 = CorUnix::InternalFwrite
                        (_Dst,1,(long)(iVar8 + iVar1),stream->bsdFilePtr,&stream->PALferrorCode);
      IVar3 = (INT)sVar6;
      if ((stream->PALferrorCode == 1) && (PAL_InitializeChakraCoreCalled == false))
      goto LAB_0011a3a1;
      goto LAB_0011a371;
    }
  }
  else {
    eVar2 = strcpy_s(_Dst,(long)iVar7,In);
    if (eVar2 == 0) {
      _Dst_00 = _Dst + iVar1;
      iVar7 = iVar7 - iVar1;
      goto LAB_0011a2e0;
    }
  }
  if (PAL_InitializeChakraCoreCalled == false) {
LAB_0011a3a1:
    abort();
  }
  piVar5 = __errno_location();
  *piVar5 = 0x7a;
  IVar3 = -1;
LAB_0011a371:
  CorUnix::InternalFree(_Dst);
  return IVar3;
}

Assistant:

INT Internal_AddPaddingVfprintf(CPalThread *pthrCurrent, PAL_FILE *stream, LPSTR In,
                                       INT Padding, INT Flags)
{
    LPSTR Out;
    INT LengthInStr;
    INT Length;
    LPSTR OutOriginal;
    INT Written;

    LengthInStr = strlen(In);
    Length = LengthInStr;

    if (Padding > 0)
    {
        Length += Padding;
    }
    Out = (LPSTR) InternalMalloc(Length+1);
    int iLength = Length+1;
    if (!Out)
    {
        ERROR("InternalMalloc failed\n");
        pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        return -1;
    }
    OutOriginal = Out;

    if (Flags & PFF_MINUS) /* pad on right */
    {
        if (strcpy_s(Out, iLength, In) != SAFECRT_SUCCESS)
        {
            ERROR("strcpy_s failed\n");
            pthrCurrent->SetLastError(ERROR_INSUFFICIENT_BUFFER);
            Written = -1;
            goto Done;
        }

        Out += LengthInStr;
        iLength -= LengthInStr;
    }
    if (Padding > 0)
    {
        iLength -= Padding;
        if (Flags & PFF_ZERO) /* '0', pad with zeros */
        {
            while (Padding--)
            {
                *Out++ = '0';
            }
        }
        else /* pad with spaces */
        {
            while (Padding--)
            {
                *Out++ = ' ';
            }
        }
    }
    if (!(Flags & PFF_MINUS)) /* put 'In' after padding */
    {
        if (strcpy_s(Out, iLength, In) != SAFECRT_SUCCESS)
        {
            ERROR("strcpy_s failed\n");
            pthrCurrent->SetLastError(ERROR_INSUFFICIENT_BUFFER);
            Written = -1;
            goto Done;
        }

        Out += LengthInStr;
        iLength -= LengthInStr;
    }

#if FILE_OPS_CHECK_FERROR_OF_PREVIOUS_CALL
    clearerr (stream->bsdFilePtr);
#endif

    Written = InternalFwrite(OutOriginal, 1, Length, stream->bsdFilePtr, &stream->PALferrorCode);
    if (stream->PALferrorCode == PAL_FILE_ERROR)
    {
        ERROR("fwrite() failed with errno == %d\n", errno);
    }

Done:
    InternalFree(OutOriginal);

    return Written;
}